

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

PatchList re2::PatchList::Append(Inst *inst0,PatchList l1,PatchList l2)

{
  PatchList PVar1;
  Inst *ip;
  PatchList local_24;
  PatchList next;
  PatchList l;
  Inst *inst0_local;
  PatchList l2_local;
  PatchList l1_local;
  
  l2_local.p = l2.p;
  if ((l1.p != 0) && (PVar1.p = l1.p, l2_local.p = l1.p, l2.p != 0)) {
    do {
      local_24.p = PVar1.p;
      PVar1 = Deref(inst0,local_24);
    } while (PVar1.p != 0);
    if ((local_24.p & 1) == 0) {
      Prog::Inst::set_out(inst0 + (local_24.p >> 1),l2.p);
    }
    else {
      inst0[local_24.p >> 1].field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)l2.p;
    }
  }
  return (PatchList)l2_local.p;
}

Assistant:

PatchList PatchList::Append(Prog::Inst* inst0, PatchList l1, PatchList l2) {
  if (l1.p == 0)
    return l2;
  if (l2.p == 0)
    return l1;

  PatchList l = l1;
  for (;;) {
    PatchList next = PatchList::Deref(inst0, l);
    if (next.p == 0)
      break;
    l = next;
  }

  Prog::Inst* ip = &inst0[l.p>>1];
  if (l.p&1)
    ip->out1_ = l2.p;
  else
    ip->set_out(l2.p);

  return l1;
}